

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

void cimg_library::CImgDisplay::_render_resize<unsigned_int,unsigned_int>
               (uint *ptrs,uint ws,uint hs,uint *ptrd,uint wd,uint hd)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  uint *puVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  unsigned_long *puVar10;
  unsigned_long *puVar11;
  unsigned_long local_78;
  CImg<unsigned_long> off_y;
  CImg<unsigned_long> off_x;
  
  CImg<unsigned_long>::CImg(&off_x,wd,1,1,1);
  CImg<unsigned_long>::CImg(&off_y,hd + 1,1,1,1);
  uVar9 = (ulong)ws;
  uVar6 = (ulong)wd;
  if (wd == ws) {
    local_78 = 1;
    CImg<unsigned_long>::fill(&off_x,&local_78);
  }
  else {
    uVar2 = uVar9;
    uVar7 = 0;
    for (uVar8 = 0; uVar6 != uVar8; uVar8 = uVar8 + 1) {
      uVar1 = uVar2 / uVar6;
      off_x._data[uVar8] = uVar1 - uVar7;
      uVar2 = uVar2 + uVar9;
      uVar7 = uVar1;
    }
  }
  if (hd == hs) {
    local_78 = uVar9;
    CImg<unsigned_long>::fill(&off_y,&local_78);
    puVar10 = off_y._data;
  }
  else {
    uVar2 = (ulong)hs;
    uVar7 = 0;
    for (uVar8 = 0; hd != uVar8; uVar8 = uVar8 + 1) {
      uVar1 = uVar2 / hd;
      off_y._data[uVar8] = (uVar1 - uVar7) * uVar9;
      uVar2 = uVar2 + hs;
      uVar7 = uVar1;
    }
    off_y._data[uVar8] = 0;
    puVar10 = off_y._data;
  }
  uVar5 = 0;
  while (uVar5 < hd) {
    puVar4 = ptrs;
    for (lVar3 = 0; puVar11 = puVar10, wd != (uint)lVar3; lVar3 = lVar3 + 1) {
      *ptrd = *puVar4;
      ptrd = ptrd + 1;
      puVar4 = puVar4 + off_x._data[lVar3];
    }
    while( true ) {
      uVar5 = uVar5 + 1;
      puVar10 = puVar11 + 1;
      if ((*puVar11 != 0) || (hd <= uVar5)) break;
      memcpy(ptrd,ptrd + -uVar6,uVar6 * 4);
      ptrd = ptrd + uVar6;
      puVar11 = puVar10;
    }
    ptrs = ptrs + *puVar11;
  }
  CImg<unsigned_long>::~CImg(&off_y);
  CImg<unsigned_long>::~CImg(&off_x);
  return;
}

Assistant:

static void _render_resize(const T *ptrs, const unsigned int ws, const unsigned int hs,
                               t *ptrd, const unsigned int wd, const unsigned int hd) {
      typedef typename cimg::last<T,cimg_ulong>::type ulongT;
      const ulongT one = (ulongT)1;
      CImg<ulongT> off_x(wd), off_y(hd + 1);
      if (wd==ws) off_x.fill(1);
      else {
        ulongT *poff_x = off_x._data, curr = 0;
        for (unsigned int x = 0; x<wd; ++x) {
          const ulongT old = curr;
          curr = (x + one)*ws/wd;
          *(poff_x++) = curr - old;
        }
      }
      if (hd==hs) off_y.fill(ws);
      else {
        ulongT *poff_y = off_y._data, curr = 0;
        for (unsigned int y = 0; y<hd; ++y) {
          const ulongT old = curr;
          curr = (y + one)*hs/hd;
          *(poff_y++) = ws*(curr - old);
        }
        *poff_y = 0;
      }
      ulongT *poff_y = off_y._data;
      for (unsigned int y = 0; y<hd; ) {
        const T *ptr = ptrs;
        ulongT *poff_x = off_x._data;
        for (unsigned int x = 0; x<wd; ++x) { *(ptrd++) = *ptr; ptr+=*(poff_x++); }
        ++y;
        ulongT dy = *(poff_y++);
        for ( ; !dy && y<hd; std::memcpy(ptrd,ptrd - wd,sizeof(t)*wd), ++y, ptrd+=wd, dy = *(poff_y++)) {}
        ptrs+=dy;
      }
    }